

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMS_RSA_PARMS_Marshal(TPMS_RSA_PARMS *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  
  UVar1 = TPMT_SYM_DEF_OBJECT_Marshal(&source->symmetric,buffer,size);
  UINT16_Marshal(&(source->scheme).scheme,buffer,size);
  UVar2 = TPMU_ASYM_SCHEME_Marshal
                    (&(source->scheme).details,buffer,size,(uint)(source->scheme).scheme);
  UINT16_Marshal(&source->keyBits,buffer,size);
  UINT32_Marshal(&source->exponent,buffer,size);
  return UVar1 + UVar2 + 8;
}

Assistant:

UINT16
TPMS_RSA_PARMS_Marshal(TPMS_RSA_PARMS *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&(source->symmetric), buffer, size));
    result = (UINT16)(result + TPMT_RSA_SCHEME_Marshal((TPMT_RSA_SCHEME *)&(source->scheme), buffer, size));
    result = (UINT16)(result + TPMI_RSA_KEY_BITS_Marshal((TPMI_RSA_KEY_BITS *)&(source->keyBits), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->exponent), buffer, size));
    return result;
}